

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ptr<resp_msg> __thiscall nuraft::raft_server::handle_reconnect_req(raft_server *this,req_msg *req)

{
  timer_helper *this_00;
  uint uVar1;
  undefined4 uVar2;
  ulong uVar3;
  _func_int *p_Var4;
  long lVar5;
  _func_int **pp_Var6;
  pointer psVar7;
  int iVar8;
  element_type *peVar9;
  long lVar10;
  long in_RDX;
  undefined **ppuVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _func_int *p_Var13;
  _func_int *p_Var14;
  undefined1 auVar15 [16];
  ptr<resp_msg> pVar16;
  string local_50;
  
  uVar1 = *(uint *)(in_RDX + 0x14);
  p_Var13 = req[9].super_msg_base._vptr_msg_base[1];
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar9 = (element_type *)operator_new(0xb0);
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar9->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4200;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar9->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var13;
  *(undefined4 *)&(peVar9->bg_append_thread_)._M_id._M_thread = 0x1b;
  *(undefined4 *)((long)&(peVar9->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(uint *)&peVar9->bg_append_ea_ = uVar1;
  ppuVar11 = &PTR__resp_msg_005c4250;
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005c4250;
  (peVar9->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->votes_responded_ = 0;
  peVar9->votes_granted_ = 0;
  (peVar9->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar9->priority_change_timer_).first_event_fired_ = 0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar9->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar9->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar9->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar9->field_0x31 = 0;
  peVar9->leader_ = (__atomic_base<int>)0x0;
  peVar9->id_ = 0;
  peVar9->my_priority_ = 0;
  *(undefined1 *)&peVar9->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
    uVar3 = req[6].super_msg_base.term_;
    p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)(long)(int)uVar1 % uVar3);
    p_Var13 = req[6].super_msg_base._vptr_msg_base[(long)p_Var12];
    ppuVar11 = (undefined **)p_Var12;
    p_Var14 = (_func_int *)0x0;
    if ((p_Var13 != (_func_int *)0x0) &&
       (p_Var4 = *(_func_int **)p_Var13, p_Var14 = p_Var13,
       uVar1 != *(uint *)(*(_func_int **)p_Var13 + 8))) {
      while (p_Var13 = p_Var4, p_Var4 = *(_func_int **)p_Var13, p_Var4 != (_func_int *)0x0) {
        ppuVar11 = (undefined **)((ulong)(long)(int)*(uint *)(p_Var4 + 8) % uVar3);
        p_Var14 = (_func_int *)0x0;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar11 != p_Var12) ||
           (p_Var14 = p_Var13, uVar1 == *(uint *)(p_Var4 + 8))) goto LAB_001b538f;
      }
      p_Var14 = (_func_int *)0x0;
    }
LAB_001b538f:
    if (p_Var14 == (_func_int *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = *(long *)p_Var14;
    }
    if (lVar10 != 0) {
      lVar5 = *(long *)(lVar10 + 0x10);
      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 0x18);
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        }
      }
      this_00 = (timer_helper *)(lVar5 + 0x1e8);
      timer_helper::set_duration_us(this_00,3000000);
      timer_helper::reset(this_00);
      LOCK();
      *(undefined1 *)(lVar5 + 0x1e5) = 1;
      UNLOCK();
      pp_Var6 = this->_vptr_raft_server;
      auVar15 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      ppuVar11 = auVar15._8_8_;
      pp_Var6[4] = auVar15._0_8_;
      *(undefined1 *)(pp_Var6 + 6) = 1;
      psVar7 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((psVar7 != (pointer)0x0) &&
         (iVar8 = (*(code *)(psVar7->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
         , ppuVar11 = (undefined **)extraout_RDX_04, 3 < iVar8)) {
        psVar7 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_50,"re-connection to peer %d scheduled",(ulong)uVar1);
        (*(code *)(psVar7->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_reconnect_req",0x3b7,&local_50);
        ppuVar11 = (undefined **)extraout_RDX_05;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          ppuVar11 = (undefined **)extraout_RDX_06;
        }
      }
      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
        ppuVar11 = (undefined **)extraout_RDX_07;
      }
      goto LAB_001b5508;
    }
    psVar7 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar7 == (pointer)0x0) ||
       (iVar8 = (*(code *)(psVar7->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       ppuVar11 = (undefined **)extraout_RDX_01, iVar8 < 2)) goto LAB_001b5508;
    psVar7 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_(&local_50,"cannot find peer %d to re-connect",(ulong)uVar1);
    (*(code *)(psVar7->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar7,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3af,&local_50);
    ppuVar11 = (undefined **)extraout_RDX_02;
  }
  else {
    psVar7 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar7 == (pointer)0x0) ||
       (iVar8 = (*(code *)(psVar7->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       ppuVar11 = (undefined **)extraout_RDX, iVar8 < 2)) goto LAB_001b5508;
    psVar7 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_50,"this node is not a leader (upon re-connect req from peer %d)",(ulong)uVar1
              );
    (*(code *)(psVar7->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar7,2,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
      ,"handle_reconnect_req",0x3a9,&local_50);
    ppuVar11 = (undefined **)extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    ppuVar11 = (undefined **)extraout_RDX_03;
  }
LAB_001b5508:
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar11;
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_reconnect_req(req_msg& req) {
    int32 srv_id = req.get_src();
    ptr<resp_msg> resp( cs_new<resp_msg>
                        ( state_->get_term(),
                          msg_type::reconnect_response,
                          id_,
                          srv_id ) );
    if (role_ != srv_role::leader) {
        p_er("this node is not a leader "
             "(upon re-connect req from peer %d)",
             srv_id);
        return resp;
    }

    auto entry = peers_.find(srv_id);
    if (entry == peers_.end()) {
        p_er("cannot find peer %d to re-connect", srv_id);
        return resp;
    }

    // Schedule re-connection.
    ptr<peer> pp = entry->second;
    pp->schedule_reconnection();
    resp->accept(log_store_->next_slot());
    p_in("re-connection to peer %d scheduled", srv_id);

    return resp;
}